

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int memory_free_riscv64(uc_struct_conflict13 *uc)

{
  MemoryRegion *pMVar1;
  MemoryRegion_conflict *mr;
  MemoryRegion_conflict *subregion_next;
  MemoryRegion_conflict *subregion;
  uc_struct_conflict13 *uc_local;
  
  subregion_next = (MemoryRegion_conflict *)(uc->system_memory->subregions).tqh_first;
  while (subregion_next != (MemoryRegion_conflict *)0x0) {
    pMVar1 = (subregion_next->subregions_link).tqe_next;
    subregion_next->enabled = false;
    memory_region_del_subregion_riscv64((MemoryRegion_conflict *)uc->system_memory,subregion_next);
    (*subregion_next->destructor)((MemoryRegion *)subregion_next);
    g_free(subregion_next);
    subregion_next = (MemoryRegion_conflict *)pMVar1;
  }
  return 0;
}

Assistant:

int memory_free(struct uc_struct *uc)
{
    MemoryRegion *subregion, *subregion_next;
    MemoryRegion *mr = uc->system_memory;

    QTAILQ_FOREACH_SAFE(subregion, &mr->subregions, subregions_link, subregion_next) {
        subregion->enabled = false;
        memory_region_del_subregion(uc->system_memory, subregion);
        subregion->destructor(subregion);
        /* destroy subregion */
        g_free(subregion);
    }

    return 0;
}